

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O0

void __thiscall
amrex::MLCellLinOp::compGrad
          (MLCellLinOp *this,int amrlev,Array<MultiFab_*,_3> *grad,MultiFab *sol,Location param_5)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  pointer i_00;
  Geometry *pGVar4;
  FabArrayBase *in_RCX;
  int in_ESI;
  long *in_RDI;
  int i_2;
  int j_2;
  int k_2;
  int n_2;
  Dim3 amrex_i_hi_2;
  Dim3 amrex_i_lo_2;
  int i_1;
  int j_1;
  int k_1;
  int n_1;
  Dim3 amrex_i_hi_1;
  Dim3 amrex_i_lo_1;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<double> *gz;
  Array4<double> *gy;
  Array4<double> *gx;
  Array4<double> *s;
  Box *zbx;
  Box *ybx;
  Box *xbx;
  MFIter mfi;
  Real dzi;
  Real dyi;
  Real dxi;
  int ncomp;
  int mglev;
  size_type in_stack_fffffffffffff968;
  undefined4 in_stack_fffffffffffff970;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffff974;
  FabArray<amrex::FArrayBox> *this_00;
  char *in_stack_fffffffffffff980;
  int *piVar6;
  undefined8 in_stack_fffffffffffff990;
  undefined1 do_tiling_;
  long *plVar7;
  undefined4 in_stack_fffffffffffff998;
  undefined4 in_stack_fffffffffffff99c;
  MFIter *in_stack_fffffffffffff9a0;
  int in_stack_fffffffffffff9e0;
  int in_stack_fffffffffffff9e4;
  int local_618;
  int local_614;
  int local_5d0;
  int local_5cc;
  int local_5c8;
  int local_5c4;
  int local_580;
  int local_57c;
  BATType local_578;
  int local_574;
  long local_530;
  long local_528;
  long local_520;
  long local_518;
  int local_510;
  int local_50c;
  int local_508;
  long *local_4f0;
  long local_4e8 [8];
  long *local_4a8;
  long local_4a0 [8];
  long *local_460;
  long local_458 [8];
  long *local_418;
  int local_40c [7];
  int *local_3f0;
  int local_3e4 [7];
  int *local_3c8;
  undefined1 local_3bc [132];
  Real local_338;
  Real local_330;
  Real local_328;
  uint local_31c;
  undefined4 local_318;
  FabArrayBase *local_310;
  int local_2fc;
  undefined8 local_2f0;
  int local_2e8;
  int *local_2e0;
  int local_2d4;
  int iStack_2d0;
  int local_2cc;
  undefined8 local_2c8;
  int local_2c0;
  int *local_2b8;
  int local_2ac;
  int iStack_2a8;
  int local_2a4;
  undefined8 local_2a0;
  BATType local_298;
  FabArray<amrex::FArrayBox> *local_290;
  int local_284;
  int iStack_280;
  BATType local_27c;
  undefined8 local_278;
  int local_270;
  int *local_268;
  int local_25c;
  int iStack_258;
  int local_254;
  undefined8 local_250;
  int local_248;
  int *local_240;
  int local_234;
  int iStack_230;
  int local_22c;
  undefined8 local_228;
  int local_220;
  FabArray<amrex::FArrayBox> *local_218;
  uint local_20c;
  int iStack_208;
  int local_204;
  int local_200;
  int local_1fc;
  int local_1f8;
  int local_1f4;
  long *local_1f0;
  int local_1e8;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  long *local_1d8;
  int local_1d0;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  long *local_1c0;
  int local_1b8;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  long *local_1a8;
  int local_1a0;
  int local_19c;
  int local_198;
  int local_194;
  long *local_190;
  int local_188;
  int local_184;
  int local_180;
  int local_17c;
  long *local_178;
  int local_170;
  BATType local_16c;
  int local_168;
  int local_164;
  long *local_160;
  int local_158;
  BATType local_154;
  int local_150;
  int local_14c;
  long *local_148;
  int local_140;
  BATType local_13c;
  int local_138;
  int local_134;
  long *local_130;
  undefined4 local_124;
  BATOp *local_120;
  undefined4 local_114;
  BATOp *local_110;
  undefined4 local_104;
  BATOp *local_100;
  undefined4 local_f4;
  int *local_f0;
  undefined4 local_e4;
  int *local_e0;
  undefined4 local_d4;
  int *local_d0;
  undefined4 local_c4;
  int *local_c0;
  undefined4 local_b4;
  int *local_b0;
  undefined4 local_a4;
  int *local_a0;
  undefined4 local_94;
  FabArray<amrex::FArrayBox> *local_90;
  undefined4 local_84;
  FabArray<amrex::FArrayBox> *local_80;
  undefined4 local_74;
  FabArray<amrex::FArrayBox> *local_70;
  undefined4 local_64;
  int *local_60;
  undefined4 local_54;
  int *local_50;
  undefined4 local_44;
  int *local_40;
  undefined4 local_34;
  int *local_30;
  undefined4 local_24;
  int *local_20;
  undefined4 local_14;
  int *local_10;
  char *local_8;
  
  do_tiling_ = (undefined1)((ulong)in_stack_fffffffffffff990 >> 0x38);
  local_310 = in_RCX;
  local_2fc = in_ESI;
  iVar3 = FabArrayBase::nComp(in_RCX);
  if (1 < iVar3) {
    local_8 = "MLCellLinOp::compGrad called, but only works for single-component solves";
    Abort_host(in_stack_fffffffffffff980);
  }
  local_318 = 0;
  Vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
               in_stack_fffffffffffff968);
  i_00 = std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>::get
                   ((unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_> *)
                    CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970));
  uVar5 = 0;
  (**(code **)(*in_RDI + 0x238))(in_RDI,local_2fc,0,local_310,1);
  local_31c = (**(code **)(*in_RDI + 0x28))();
  Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff974,uVar5),(size_type)i_00);
  pGVar4 = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                     ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                      CONCAT44(in_stack_fffffffffffff974,uVar5),(size_type)i_00);
  local_328 = CoordSys::InvCellSize(&pGVar4->super_CoordSys,0);
  Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff974,uVar5),(size_type)i_00);
  pGVar4 = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                     ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                      CONCAT44(in_stack_fffffffffffff974,uVar5),(size_type)i_00);
  local_330 = CoordSys::InvCellSize(&pGVar4->super_CoordSys,1);
  Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff974,uVar5),(size_type)i_00);
  pGVar4 = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                     ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                      CONCAT44(in_stack_fffffffffffff974,uVar5),(size_type)i_00);
  local_338 = CoordSys::InvCellSize(&pGVar4->super_CoordSys,2);
  TilingIfNotGPU();
  MFIter::MFIter(in_stack_fffffffffffff9a0,
                 (FabArrayBase *)CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998),
                 (bool)do_tiling_);
  while (bVar2 = MFIter::isValid((MFIter *)(local_3bc + 0x24)), bVar2) {
    this_00 = (FabArray<amrex::FArrayBox> *)local_3bc;
    MFIter::nodaltilebox
              ((MFIter *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
               (int)((ulong)in_RDI >> 0x20));
    piVar6 = local_3e4;
    local_3bc._28_8_ = this_00;
    MFIter::nodaltilebox
              ((MFIter *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
               (int)((ulong)in_RDI >> 0x20));
    local_3c8 = piVar6;
    MFIter::nodaltilebox
              ((MFIter *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
               (int)((ulong)in_RDI >> 0x20));
    plVar7 = local_458;
    local_3f0 = local_40c;
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (this_00,(MFIter *)CONCAT44(in_stack_fffffffffffff974,uVar5));
    local_418 = plVar7;
    std::array<amrex::MultiFab_*,_3UL>::operator[]
              ((array<amrex::MultiFab_*,_3UL> *)CONCAT44(in_stack_fffffffffffff974,uVar5),
               (size_type)i_00);
    plVar7 = local_4a0;
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (this_00,(MFIter *)CONCAT44(in_stack_fffffffffffff974,uVar5));
    local_460 = plVar7;
    std::array<amrex::MultiFab_*,_3UL>::operator[]
              ((array<amrex::MultiFab_*,_3UL> *)CONCAT44(in_stack_fffffffffffff974,uVar5),
               (size_type)i_00);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (this_00,(MFIter *)CONCAT44(in_stack_fffffffffffff974,uVar5));
    local_4a8 = local_4e8;
    std::array<amrex::MultiFab_*,_3UL>::operator[]
              ((array<amrex::MultiFab_*,_3UL> *)CONCAT44(in_stack_fffffffffffff974,uVar5),
               (size_type)i_00);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (this_00,(MFIter *)CONCAT44(in_stack_fffffffffffff974,uVar5));
    local_290 = (FabArray<amrex::FArrayBox> *)local_3bc._28_8_;
    local_70 = (FabArray<amrex::FArrayBox> *)local_3bc._28_8_;
    local_74 = 0;
    local_284 = *(int *)local_3bc._28_8_;
    local_80 = (FabArray<amrex::FArrayBox> *)local_3bc._28_8_;
    local_84 = 1;
    iStack_280 = *(int *)(local_3bc._28_8_ + 4);
    local_2a0 = *(undefined8 *)local_3bc._28_8_;
    local_90 = (FabArray<amrex::FArrayBox> *)local_3bc._28_8_;
    local_94 = 2;
    local_298 = (((BoxArray *)(local_3bc._28_8_ + 8))->m_bat).m_bat_type;
    local_218 = (FabArray<amrex::FArrayBox> *)local_3bc._28_8_;
    local_100 = (BATOp *)(local_3bc._28_8_ + 0xc);
    local_104 = 0;
    local_20c = (local_100->m_indexType).m_typ.itype;
    local_110 = (BATOp *)(local_3bc._28_8_ + 0xc);
    local_114 = 1;
    iStack_208 = *(int *)(local_3bc._28_8_ + 0x10);
    local_228 = *(undefined8 *)local_100;
    local_120 = (BATOp *)(local_3bc._28_8_ + 0xc);
    local_124 = 2;
    local_220 = *(int *)(local_3bc._28_8_ + 0x14);
    for (local_574 = 0; local_578 = local_298, local_574 < (int)local_31c; local_574 = local_574 + 1
        ) {
      for (; local_57c = iStack_280, (int)local_578 <= local_220; local_578 = local_578 + indexType)
      {
        for (; local_580 = local_284, local_57c <= iStack_208; local_57c = local_57c + 1) {
          for (; local_580 <= (int)local_20c; local_580 = local_580 + 1) {
            local_130 = local_418;
            local_134 = local_580;
            local_138 = local_57c;
            local_13c = local_578;
            local_140 = local_574;
            local_148 = local_418;
            local_14c = local_580 + -1;
            local_150 = local_57c;
            local_154 = local_578;
            local_158 = local_574;
            local_160 = local_460;
            local_164 = local_580;
            local_168 = local_57c;
            local_16c = local_578;
            local_170 = local_574;
            *(double *)
             (*local_460 +
             ((long)(local_580 - (int)local_460[4]) +
              (long)(local_57c - *(int *)((long)local_460 + 0x24)) * local_460[1] +
              (long)(int)(local_578 - (int)local_460[5]) * local_460[2] +
             (long)local_574 * local_460[3]) * 8) =
                 local_328 *
                 (*(double *)
                   (*local_418 +
                   ((long)(local_580 - (int)local_418[4]) +
                    (long)(local_57c - *(int *)((long)local_418 + 0x24)) * local_418[1] +
                    (long)(int)(local_578 - (int)local_418[5]) * local_418[2] +
                   (long)local_574 * local_418[3]) * 8) -
                 *(double *)
                  (*local_418 +
                  ((long)(local_14c - (int)local_418[4]) +
                   (long)(local_57c - *(int *)((long)local_418 + 0x24)) * local_418[1] +
                   (long)(int)(local_578 - (int)local_418[5]) * local_418[2] +
                  (long)local_574 * local_418[3]) * 8));
          }
        }
      }
    }
    local_2b8 = local_3c8;
    local_40 = local_3c8;
    local_44 = 0;
    local_2ac = *local_3c8;
    local_50 = local_3c8;
    local_54 = 1;
    iStack_2a8 = local_3c8[1];
    local_2c8 = *(undefined8 *)local_3c8;
    local_60 = local_3c8;
    local_64 = 2;
    local_2c0 = local_3c8[2];
    local_240 = local_3c8;
    local_d0 = local_3c8 + 3;
    local_d4 = 0;
    local_234 = *local_d0;
    local_e0 = local_3c8 + 3;
    local_e4 = 1;
    iStack_230 = local_3c8[4];
    local_250 = *(undefined8 *)local_d0;
    local_f0 = local_3c8 + 3;
    local_f4 = 2;
    local_248 = local_3c8[5];
    for (local_5c4 = 0; local_5c8 = local_2c0, local_5c4 < (int)local_31c; local_5c4 = local_5c4 + 1
        ) {
      for (; local_5cc = iStack_2a8, local_5c8 <= local_248; local_5c8 = local_5c8 + 1) {
        for (; local_5d0 = local_2ac, local_5cc <= iStack_230; local_5cc = local_5cc + 1) {
          for (; local_5d0 <= local_234; local_5d0 = local_5d0 + 1) {
            local_178 = local_418;
            local_17c = local_5d0;
            local_180 = local_5cc;
            local_184 = local_5c8;
            local_188 = local_5c4;
            local_190 = local_418;
            local_194 = local_5d0;
            local_198 = local_5cc + -1;
            local_19c = local_5c8;
            local_1a0 = local_5c4;
            local_1a8 = local_4a8;
            local_1ac = local_5d0;
            local_1b0 = local_5cc;
            local_1b4 = local_5c8;
            local_1b8 = local_5c4;
            *(double *)
             (*local_4a8 +
             ((long)(local_5d0 - (int)local_4a8[4]) +
              (long)(local_5cc - *(int *)((long)local_4a8 + 0x24)) * local_4a8[1] +
              (long)(local_5c8 - (int)local_4a8[5]) * local_4a8[2] + (long)local_5c4 * local_4a8[3])
             * 8) = local_330 *
                    (*(double *)
                      (*local_418 +
                      ((long)(local_5d0 - (int)local_418[4]) +
                       (long)(local_5cc - *(int *)((long)local_418 + 0x24)) * local_418[1] +
                       (long)(local_5c8 - (int)local_418[5]) * local_418[2] +
                      (long)local_5c4 * local_418[3]) * 8) -
                    *(double *)
                     (*local_418 +
                     ((long)(local_5d0 - (int)local_418[4]) +
                      (long)(local_198 - *(int *)((long)local_418 + 0x24)) * local_418[1] +
                      (long)(local_5c8 - (int)local_418[5]) * local_418[2] +
                     (long)local_5c4 * local_418[3]) * 8));
          }
        }
      }
    }
    local_2e0 = local_3f0;
    local_10 = local_3f0;
    local_14 = 0;
    local_2d4 = *local_3f0;
    local_20 = local_3f0;
    local_24 = 1;
    iStack_2d0 = local_3f0[1];
    local_2f0 = *(undefined8 *)local_3f0;
    local_30 = local_3f0;
    local_34 = 2;
    local_2e8 = local_3f0[2];
    local_268 = local_3f0;
    local_a0 = local_3f0 + 3;
    local_a4 = 0;
    local_25c = *local_a0;
    local_b0 = local_3f0 + 3;
    local_b4 = 1;
    iStack_258 = local_3f0[4];
    local_278 = *(undefined8 *)local_a0;
    local_c0 = local_3f0 + 3;
    local_c4 = 2;
    local_270 = local_3f0[5];
    for (local_614 = 0; local_618 = local_2e8, local_614 < (int)local_31c; local_614 = local_614 + 1
        ) {
      for (; iVar3 = iStack_2d0, local_618 <= local_270; local_618 = local_618 + 1) {
        for (; iVar1 = local_2d4, iVar3 <= iStack_258; iVar3 = iVar3 + 1) {
          while (in_stack_fffffffffffff9e0 = iVar1, in_stack_fffffffffffff9e0 <= local_25c) {
            local_1c0 = local_418;
            local_1cc = local_618;
            local_1d0 = local_614;
            local_1d8 = local_418;
            local_1e4 = local_618 + -1;
            local_1e8 = local_614;
            local_1fc = local_618;
            local_200 = local_614;
            *(double *)
             (local_530 +
             ((long)(in_stack_fffffffffffff9e0 - local_510) + (iVar3 - local_50c) * local_528 +
              (local_618 - local_508) * local_520 + local_614 * local_518) * 8) =
                 local_338 *
                 (*(double *)
                   (*local_418 +
                   ((long)(in_stack_fffffffffffff9e0 - (int)local_418[4]) +
                    (long)(iVar3 - *(int *)((long)local_418 + 0x24)) * local_418[1] +
                    (long)(local_618 - (int)local_418[5]) * local_418[2] +
                   (long)local_614 * local_418[3]) * 8) -
                 *(double *)
                  (*local_418 +
                  ((long)(in_stack_fffffffffffff9e0 - (int)local_418[4]) +
                   (long)(iVar3 - *(int *)((long)local_418 + 0x24)) * local_418[1] +
                   (long)(local_1e4 - (int)local_418[5]) * local_418[2] +
                  (long)local_614 * local_418[3]) * 8));
            local_1f8 = iVar3;
            local_1f4 = in_stack_fffffffffffff9e0;
            local_1f0 = &local_530;
            local_1e0 = iVar3;
            local_1dc = in_stack_fffffffffffff9e0;
            local_1c8 = iVar3;
            local_1c4 = in_stack_fffffffffffff9e0;
            iVar1 = in_stack_fffffffffffff9e0 + 1;
          }
        }
        in_stack_fffffffffffff9e4 = iVar3;
      }
    }
    local_4f0 = &local_530;
    local_2cc = local_2e8;
    local_2a4 = local_2c0;
    local_27c = local_298;
    local_254 = local_270;
    local_22c = local_248;
    local_204 = local_220;
    MFIter::operator++((MFIter *)(local_3bc + 0x24));
  }
  MFIter::~MFIter((MFIter *)CONCAT44(in_stack_fffffffffffff974,uVar5));
  return;
}

Assistant:

void
MLCellLinOp::compGrad (int amrlev, const Array<MultiFab*,AMREX_SPACEDIM>& grad,
                       MultiFab& sol, Location /*loc*/) const
{
    BL_PROFILE("MLCellLinOp::compGrad()");

    if (sol.nComp() > 1)
      amrex::Abort("MLCellLinOp::compGrad called, but only works for single-component solves");

    const int mglev = 0;
    applyBC(amrlev, mglev, sol, BCMode::Inhomogeneous, StateMode::Solution,
            m_bndry_sol[amrlev].get());

    const int ncomp = getNComp();

    AMREX_D_TERM(const Real dxi = m_geom[amrlev][mglev].InvCellSize(0);,
                 const Real dyi = m_geom[amrlev][mglev].InvCellSize(1);,
                 const Real dzi = m_geom[amrlev][mglev].InvCellSize(2););
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(sol, TilingIfNotGPU());  mfi.isValid(); ++mfi)
    {
        AMREX_D_TERM(const Box& xbx = mfi.nodaltilebox(0);,
                     const Box& ybx = mfi.nodaltilebox(1);,
                     const Box& zbx = mfi.nodaltilebox(2););
        const auto& s = sol.array(mfi);
        AMREX_D_TERM(const auto& gx = grad[0]->array(mfi);,
                     const auto& gy = grad[1]->array(mfi);,
                     const auto& gz = grad[2]->array(mfi););

        AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( xbx, ncomp, i, j, k, n,
        {
            gx(i,j,k,n) = dxi*(s(i,j,k,n) - s(i-1,j,k,n));
        });
#if (AMREX_SPACEDIM >= 2)
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( ybx, ncomp, i, j, k, n,
        {
            gy(i,j,k,n) = dyi*(s(i,j,k,n) - s(i,j-1,k,n));
        });
#endif
#if (AMREX_SPACEDIM == 3)
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( zbx, ncomp, i, j, k, n,
        {
            gz(i,j,k,n) = dzi*(s(i,j,k,n) - s(i,j,k-1,n));
        });
#endif
    }
}